

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

void __thiscall
wasm_foreign_t::wasm_foreign_t(wasm_foreign_t *this,RefPtr<wabt::interp::Foreign> *ptr)

{
  RefPtr<wabt::interp::Object> RStack_28;
  
  wabt::interp::RefPtr<wabt::interp::Object>::RefPtr<wabt::interp::Foreign>(&RStack_28,ptr);
  wabt::interp::RefPtr<wabt::interp::Object>::RefPtr
            ((RefPtr<wabt::interp::Object> *)this,&RStack_28);
  wabt::interp::RefPtr<wabt::interp::Object>::reset(&RStack_28);
  return;
}

Assistant:

wasm_foreign_t(RefPtr<Foreign> ptr) : wasm_ref_t(ptr) {}